

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O1

void enet_peer_dispatch_incoming_unreliable_commands(ENetPeer *peer,ENetChannel *channel)

{
  ENetList *pEVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ENetListIterator in_RDX;
  ENetListIterator extraout_RDX;
  ENetListIterator extraout_RDX_00;
  ENetListIterator extraout_RDX_01;
  ENetListIterator extraout_RDX_02;
  ENetListIterator extraout_RDX_03;
  ENetListIterator extraout_RDX_04;
  int iVar6;
  ushort uVar7;
  _ENetListNode *startCommand;
  _ENetListNode *dataFirst;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var8;
  bool bVar9;
  
  pEVar1 = &channel->incomingUnreliableCommands;
  startCommand = (channel->incomingUnreliableCommands).sentinel.next;
  dataFirst = startCommand;
  p_Var8 = startCommand;
  if (startCommand != &pEVar1->sentinel) {
    do {
      iVar6 = 4;
      if (((ulong)p_Var8[1].next & 0xf00000000) != 0x900000000) {
        uVar2 = *(ushort *)&p_Var8[1].next;
        uVar3 = channel->incomingReliableSequenceNumber;
        if (uVar2 == uVar3) {
          if (*(int *)((long)&p_Var8[4].previous + 4) == 0) {
            channel->incomingUnreliableSequenceNumber = *(enet_uint16 *)((long)&p_Var8[1].next + 2);
          }
          else {
            if (dataFirst == p_Var8) {
              if (startCommand != p_Var8) {
                startCommand = p_Var8->previous;
              }
            }
            else {
              enet_list_move(&(peer->dispatchedCommands).sentinel,dataFirst,p_Var8->previous);
              in_RDX = extraout_RDX;
              startCommand = p_Var8;
              if (peer->needsDispatch == 0) {
                enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
                peer->needsDispatch = 1;
                in_RDX = extraout_RDX_00;
              }
            }
LAB_00104e45:
            dataFirst = p_Var8->next;
            iVar6 = 0;
          }
        }
        else {
          uVar4 = uVar2 >> 0xc;
          in_RDX = (ENetListIterator)(ulong)uVar4;
          uVar5 = uVar3 >> 0xc;
          uVar7 = uVar4 + 0x10;
          if (uVar3 <= uVar2) {
            uVar7 = uVar4;
          }
          bVar9 = (ushort)(uVar5 + 7) <= uVar7;
          iVar6 = 2;
          if (bVar9 || uVar7 < uVar5) {
            startCommand = p_Var8->next;
            iVar6 = 0;
            if ((dataFirst != p_Var8) &&
               (enet_list_move(&(peer->dispatchedCommands).sentinel,dataFirst,p_Var8->previous),
               in_RDX = extraout_RDX_01, peer->needsDispatch == 0)) {
              enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
              peer->needsDispatch = 1;
              in_RDX = extraout_RDX_02;
            }
          }
          if (bVar9 || uVar7 < uVar5) goto LAB_00104e45;
        }
      }
    } while ((iVar6 != 2) && (p_Var8 = p_Var8->next, p_Var8 != &pEVar1->sentinel));
  }
  if ((dataFirst != p_Var8) &&
     (enet_list_move(&(peer->dispatchedCommands).sentinel,dataFirst,p_Var8->previous),
     in_RDX = extraout_RDX_03, startCommand = p_Var8, peer->needsDispatch == 0)) {
    enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
    peer->needsDispatch = 1;
    in_RDX = extraout_RDX_04;
  }
  enet_peer_remove_incoming_commands((ENetList *)(pEVar1->sentinel).next,startCommand,in_RDX);
  return;
}

Assistant:

void
enet_peer_dispatch_incoming_unreliable_commands (ENetPeer * peer, ENetChannel * channel)
{
    ENetListIterator droppedCommand, startCommand, currentCommand;

    for (droppedCommand = startCommand = currentCommand = enet_list_begin (& channel -> incomingUnreliableCommands);
         currentCommand != enet_list_end (& channel -> incomingUnreliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;

       if ((incomingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED)
         continue;

       if (incomingCommand -> reliableSequenceNumber == channel -> incomingReliableSequenceNumber)
       {
          if (incomingCommand -> fragmentsRemaining <= 0)
          {
             channel -> incomingUnreliableSequenceNumber = incomingCommand -> unreliableSequenceNumber;
             continue;
          }

          if (startCommand != currentCommand)
          {
             enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

             if (! peer -> needsDispatch)
             {
                enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

                peer -> needsDispatch = 1;
             }

             droppedCommand = currentCommand;
          }
          else
          if (droppedCommand != currentCommand)
            droppedCommand = enet_list_previous (currentCommand);
       }
       else 
       {
          enet_uint16 reliableWindow = incomingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE,
                      currentWindow = channel -> incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
          if (incomingCommand -> reliableSequenceNumber < channel -> incomingReliableSequenceNumber)
            reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
          if (reliableWindow >= currentWindow && reliableWindow < currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1)
            break;

          droppedCommand = enet_list_next (currentCommand);

          if (startCommand != currentCommand)
          {
             enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

             if (! peer -> needsDispatch)
             {
                enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

                peer -> needsDispatch = 1;
             }
          }
       }
          
       startCommand = enet_list_next (currentCommand);
    }

    if (startCommand != currentCommand)
    {
       enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

       if (! peer -> needsDispatch)
       {
           enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

           peer -> needsDispatch = 1;
       }

       droppedCommand = currentCommand;
    }

    enet_peer_remove_incoming_commands (& channel -> incomingUnreliableCommands, enet_list_begin (& channel -> incomingUnreliableCommands), droppedCommand);
}